

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# History.cpp
# Opt level: O1

void __thiscall History::History(History *this)

{
  long *local_38;
  long local_30;
  long local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"");
  this->numberOfAssignments = 0;
  this->numberOfWorkingWeekends = 0;
  this->numberOfConsecutiveAssignments = 0;
  this->numberOfConsecutiveWorkingDays = 0;
  this->numberOfConsecutiveDaysOff = 0;
  (this->lastAssignedShiftType)._M_dataplus._M_p = (pointer)&(this->lastAssignedShiftType).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->lastAssignedShiftType,local_38,local_30 + (long)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return;
}

Assistant:

History::History() : History(0,0,0,0,0,"") {}